

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_serializer.cxx
# Opt level: O3

void __thiscall nuraft::buffer_serializer::put_u8(buffer_serializer *this,uint8_t val)

{
  size_t sVar1;
  size_t sVar2;
  byte *pbVar3;
  overflow_error *this_00;
  
  sVar1 = this->pos_;
  sVar2 = buffer::size(this->buf_);
  if (sVar1 + 1 <= sVar2) {
    pbVar3 = buffer::data_begin(this->buf_);
    pbVar3[this->pos_] = val;
    pos(this,this->pos_ + 1);
    return;
  }
  this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
  std::overflow_error::overflow_error(this_00,"not enough space");
  __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
}

Assistant:

void buffer_serializer::put_u8(uint8_t val) {
    chk_length(val);
    uint8_t* ptr = buf_.data_begin() + pos_;
    ptr[0] = val;
    pos( pos() + sizeof(val) );
}